

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode cf_he_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  void *pvVar2;
  long lVar3;
  long *plVar4;
  curl_trc_feat *pcVar5;
  bool bVar6;
  int iVar7;
  CURLcode CVar8;
  long lVar9;
  _Bool bdone;
  char local_39;
  Curl_cfilter *local_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar2 = cf->ctx;
    local_38 = cf;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      lVar3 = *(long *)((long)pvVar2 + lVar9 * 8 + 0x20);
      local_39 = '\0';
      if (((lVar3 != 0) && (plVar4 = *(long **)(lVar3 + 0x28), plVar4 != (long *)0x0)) &&
         ((*(byte *)(lVar3 + 100) & 0x10) == 0)) {
        iVar7 = (**(code **)(*plVar4 + 0x28))(plVar4,data,&local_39);
        *(int *)(lVar3 + 0x5c) = iVar7;
        if ((iVar7 != 0) || (local_39 == '\x01')) {
          *(byte *)(lVar3 + 100) = *(byte *)(lVar3 + 100) | 0x10;
        }
      }
    }
    *done = true;
    bVar6 = true;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      lVar3 = *(long *)((long)pvVar2 + lVar9 * 8 + 0x20);
      if ((lVar3 != 0) && ((*(byte *)(lVar3 + 100) & 0x10) == 0)) {
        *done = false;
        bVar6 = false;
      }
    }
    CVar8 = CURLE_OK;
    if (bVar6) {
      CVar8 = CURLE_OK;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        lVar3 = *(long *)((long)pvVar2 + lVar9 * 8 + 0x20);
        if ((lVar3 != 0) && (CVar1 = *(CURLcode *)(lVar3 + 0x5c), CVar1 != CURLE_OK)) {
          CVar8 = CVar1;
        }
      }
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar5 = (data->state).feat;
      if (pcVar5 == (curl_trc_feat *)0x0) {
        if (local_38 == (Curl_cfilter *)0x0) {
          return CVar8;
        }
      }
      else {
        if (local_38 == (Curl_cfilter *)0x0) {
          return CVar8;
        }
        if (pcVar5->log_level < 1) {
          return CVar8;
        }
      }
      if (0 < local_38->cft->log_level) {
        Curl_trc_cf_infof(data,local_38,"shutdown -> %d, done=%d",(ulong)CVar8,(ulong)bVar6);
      }
    }
  }
  else {
    *done = true;
    CVar8 = CURLE_OK;
  }
  return CVar8;
}

Assistant:

static CURLcode cf_he_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];
    bool bdone = FALSE;
    if(!baller || !baller->cf || baller->shutdown)
      continue;
    baller->result = baller->cf->cft->do_shutdown(baller->cf, data, &bdone);
    if(baller->result || bdone)
      baller->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    if(ctx->baller[i] && !ctx->baller[i]->shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
      if(ctx->baller[i] && ctx->baller[i]->result)
        result = ctx->baller[i]->result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}